

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O1

Ref<glTF::Accessor>
ExportData(Asset *a,string *meshName,Ref<glTF::Buffer> *buffer,uint count,void *data,Value typeIn,
          Value typeOut,ComponentType compType,bool isIndices)

{
  Buffer *pBVar1;
  ulong __n;
  void *pvVar2;
  BufferView *pBVar3;
  Accessor *pAVar4;
  uint uVar5;
  void *__dest;
  vector<glTF::BufferView_*,_std::allocator<glTF::BufferView_*>_> *pvVar6;
  vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *pvVar7;
  runtime_error *this;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  __shared_ptr<unsigned_char,(__gnu_cxx::_Lock_policy)2> *p_Var12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  Ref<glTF::BufferView> RVar16;
  Ref<glTF::Accessor> RVar17;
  Ref<glTF::Accessor> acc;
  string local_90;
  uint local_70;
  uint local_6c;
  string *local_68;
  __shared_ptr<unsigned_char,(__gnu_cxx::_Lock_policy)2> *local_60;
  Asset *local_58;
  ulong local_50;
  ulong local_48;
  Ref<glTF::Buffer> *local_40;
  void *local_38;
  
  if (data == (void *)0x0 || count == 0) {
    pvVar7 = (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)0x0;
    uVar9 = 0;
  }
  else {
    local_38 = data;
    if ((6 < compType - ComponentType_BYTE) || ((0x6fU >> (compType & 0x1f) & 1) == 0)) {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"GLTF: Unsupported Component Type ","");
      std::__cxx11::string::push_back((char)&local_90);
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,(string *)&local_90);
      *(undefined ***)this = &PTR__runtime_error_0082bce0;
      __cxa_throw(this,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    local_48 = (ulong)*(uint *)(&DAT_0082c228 + (ulong)typeIn * 0x10);
    local_70 = *(uint *)(&DAT_0082c228 + (ulong)typeOut * 0x10);
    local_50 = (ulong)*(uint *)(&DAT_006d2418 + (ulong)(compType - ComponentType_BYTE) * 4);
    pBVar1 = (buffer->vector->super__Vector_base<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_>).
             _M_impl.super__Vector_impl_data._M_start[buffer->index];
    __n = pBVar1->byteLength;
    uVar15 = local_50 - 1 & __n;
    uVar10 = (ulong)(local_70 * count *
                    *(uint *)(&DAT_006d2418 + (ulong)(compType - ComponentType_BYTE) * 4));
    lVar13 = uVar15 + uVar10;
    local_6c = count;
    local_68 = meshName;
    local_40 = buffer;
    if (lVar13 != 0) {
      uVar11 = pBVar1->capacity;
      uVar14 = __n + lVar13;
      if (uVar11 < uVar14) {
        uVar11 = (uVar11 >> 1) + uVar11;
        if (uVar11 <= uVar14) {
          uVar11 = uVar14;
        }
        pBVar1->capacity = uVar11;
        local_58 = a;
        __dest = operator_new__(uVar11);
        pvVar2 = (pBVar1->mData).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        p_Var12 = (__shared_ptr<unsigned_char,(__gnu_cxx::_Lock_policy)2> *)&pBVar1->mData;
        if (pvVar2 != (void *)0x0) {
          local_60 = (__shared_ptr<unsigned_char,(__gnu_cxx::_Lock_policy)2> *)&pBVar1->mData;
          memcpy(__dest,pvVar2,__n);
          p_Var12 = local_60;
        }
        std::__shared_ptr<unsigned_char,(__gnu_cxx::_Lock_policy)2>::
        reset<unsigned_char,std::default_delete<unsigned_char[]>>(p_Var12,__dest);
        uVar14 = lVar13 + pBVar1->byteLength;
        a = local_58;
      }
      pBVar1->byteLength = uVar14;
    }
    glTF::Asset::FindUniqueID(&local_90,a,local_68,"view");
    RVar16 = glTF::LazyDict<glTF::BufferView>::Create(&a->bufferViews,local_90._M_dataplus._M_p);
    pvVar6 = RVar16.vector;
    uVar8 = RVar16.index;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    pBVar3 = (pvVar6->super__Vector_base<glTF::BufferView_*,_std::allocator<glTF::BufferView_*>_>).
             _M_impl.super__Vector_impl_data._M_start[uVar8];
    (pBVar3->buffer).index = local_40->index;
    (pBVar3->buffer).vector = local_40->vector;
    (pvVar6->super__Vector_base<glTF::BufferView_*,_std::allocator<glTF::BufferView_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar8]->byteOffset = uVar15 + __n & 0xffffffff;
    (pvVar6->super__Vector_base<glTF::BufferView_*,_std::allocator<glTF::BufferView_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar8]->byteLength = uVar10;
    (pvVar6->super__Vector_base<glTF::BufferView_*,_std::allocator<glTF::BufferView_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar8]->target = isIndices | BufferViewTarget_ARRAY_BUFFER;
    glTF::Asset::FindUniqueID(&local_90,a,local_68,"accessor");
    RVar17 = glTF::LazyDict<glTF::Accessor>::Create(&a->accessors,local_90._M_dataplus._M_p);
    pvVar7 = RVar17.vector;
    uVar9 = RVar17.index;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    pvVar2 = local_38;
    uVar5 = local_6c;
    pAVar4 = (pvVar7->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>).
             _M_impl.super__Vector_impl_data._M_start[uVar9];
    (pAVar4->bufferView).vector = pvVar6;
    (pAVar4->bufferView).index = uVar8;
    (pvVar7->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar9]->byteOffset = 0;
    (pvVar7->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar9]->byteStride = 0;
    (pvVar7->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar9]->componentType = compType;
    (pvVar7->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar9]->count = local_6c;
    (pvVar7->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar9]->type = typeOut;
    uVar8 = (uint)local_48;
    acc._12_4_ = 0;
    acc.vector = (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)
                 SUB128(RVar17._0_12_,0);
    acc.index = SUB124(RVar17._0_12_,8);
    SetAccessorRange(compType,acc,local_38,local_6c,uVar8,local_70);
    glTF::Accessor::WriteData
              ((pvVar7->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>).
               _M_impl.super__Vector_impl_data._M_start[uVar9],(ulong)uVar5,pvVar2,
               (ulong)(uVar8 * (int)local_50));
  }
  RVar17.index = uVar9;
  RVar17.vector = pvVar7;
  RVar17._12_4_ = 0;
  return RVar17;
}

Assistant:

inline Ref<Accessor> ExportData(Asset& a, std::string& meshName, Ref<Buffer>& buffer,
    unsigned int count, void* data, AttribType::Value typeIn, AttribType::Value typeOut, ComponentType compType, bool isIndices = false)
{
    if (!count || !data) return Ref<Accessor>();

    unsigned int numCompsIn = AttribType::GetNumComponents(typeIn);
    unsigned int numCompsOut = AttribType::GetNumComponents(typeOut);
    unsigned int bytesPerComp = ComponentTypeSize(compType);

    size_t offset = buffer->byteLength;
    // make sure offset is correctly byte-aligned, as required by spec
    size_t padding = offset % bytesPerComp;
    offset += padding;
    size_t length = count * numCompsOut * bytesPerComp;
    buffer->Grow(length + padding);

    // bufferView
    Ref<BufferView> bv = a.bufferViews.Create(a.FindUniqueID(meshName, "view"));
    bv->buffer = buffer;
    bv->byteOffset = unsigned(offset);
    bv->byteLength = length; //! The target that the WebGL buffer should be bound to.
    bv->target = isIndices ? BufferViewTarget_ELEMENT_ARRAY_BUFFER : BufferViewTarget_ARRAY_BUFFER;

    // accessor
    Ref<Accessor> acc = a.accessors.Create(a.FindUniqueID(meshName, "accessor"));
    acc->bufferView = bv;
    acc->byteOffset = 0;
    acc->byteStride = 0;
    acc->componentType = compType;
    acc->count = count;
    acc->type = typeOut;

    // calculate min and max values
	SetAccessorRange(compType, acc, data, count, numCompsIn, numCompsOut);

    // copy the data
    acc->WriteData(count, data, numCompsIn*bytesPerComp);

    return acc;
}